

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::RgbaInputFile::FromYca::FromYca
          (FromYca *this,InputPart *inputFile,RgbaChannels rgbaChannels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Header *pHVar5;
  Box2i *pBVar6;
  LineOrder *pLVar7;
  ulong uVar8;
  Rgba *pRVar9;
  Rgba *pRVar10;
  long lVar11;
  long lVar12;
  undefined8 local_30;
  float local_28;
  
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_inputPart = inputFile;
  this->_readC = (bool)((byte)rgbaChannels >> 5 & 1);
  pHVar5 = InputPart::header(inputFile);
  pBVar6 = Header::dataWindow(pHVar5);
  iVar1 = (pBVar6->min).x;
  iVar2 = (pBVar6->min).y;
  iVar3 = (pBVar6->max).x;
  iVar4 = (pBVar6->max).y;
  this->_xMin = iVar1;
  this->_yMin = iVar2;
  this->_yMax = iVar4;
  this->_width = (iVar3 - iVar1) + 1;
  this->_height = (iVar4 - iVar2) + 1;
  this->_currentScanLine = iVar2 + -0x1d;
  pHVar5 = InputPart::header(this->_inputPart);
  pLVar7 = Header::lineOrder(pHVar5);
  this->_lineOrder = *pLVar7;
  pHVar5 = InputPart::header(this->_inputPart);
  anon_unknown_1::ywFromHeader((anon_unknown_1 *)&local_30,pHVar5);
  (this->_yw).x = (float)(undefined4)local_30;
  (this->_yw).y = (float)local_30._4_4_;
  (this->_yw).z = local_28;
  iVar1 = this->_width;
  lVar12 = (long)iVar1;
  uVar8 = anon_unknown_1::cachePadding(lVar12 * 8);
  uVar8 = (uVar8 >> 3) + lVar12;
  pRVar9 = (Rgba *)operator_new__(-(ulong)((uVar8 & 0x700000000000000) != 0) | uVar8 * 0x100);
  this->_bufBase = pRVar9;
  pRVar10 = pRVar9;
  for (lVar11 = 0; lVar11 != 0x1d; lVar11 = lVar11 + 1) {
    this->_buf1[lVar11] = pRVar10;
    pRVar10 = pRVar10 + uVar8;
  }
  pRVar9 = pRVar9 + uVar8 * 0x1d;
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    this->_buf2[lVar11] = pRVar9;
    pRVar9 = pRVar9 + uVar8;
  }
  uVar8 = 0xffffffffffffffff;
  if (-0x1b < iVar1) {
    uVar8 = lVar12 * 8 + 0xd0;
  }
  pRVar10 = (Rgba *)operator_new__(uVar8);
  this->_tmpBuf = pRVar10;
  this->_fbBase = (Rgba *)0x0;
  this->_fbXStride = 0;
  this->_fbYStride = 0;
  return;
}

Assistant:

RgbaInputFile::FromYca::FromYca (
    InputPart& inputFile, RgbaChannels rgbaChannels)
    : _inputPart (inputFile)
{
    _readC = (rgbaChannels & WRITE_C) ? true : false;

    const Box2i dw = _inputPart.header ().dataWindow ();

    _xMin            = dw.min.x;
    _yMin            = dw.min.y;
    _yMax            = dw.max.y;
    _width           = dw.max.x - dw.min.x + 1;
    _height          = dw.max.y - dw.min.y + 1;
    _currentScanLine = dw.min.y - N - 2;
    _lineOrder       = _inputPart.header ().lineOrder ();
    _yw              = ywFromHeader (_inputPart.header ());

    ptrdiff_t pad = cachePadding (_width * sizeof (Rgba)) / sizeof (Rgba);

    _bufBase = new Rgba[(_width + pad) * (N + 2 + 3)];

    for (int i = 0; i < N + 2; ++i)
        _buf1[i] = _bufBase + (i * (_width + pad));

    for (int i = 0; i < 3; ++i)
        _buf2[i] = _bufBase + ((i + N + 2) * (_width + pad));

    _tmpBuf = new Rgba[_width + N - 1];

    _fbBase    = 0;
    _fbXStride = 0;
    _fbYStride = 0;
}